

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::IsLinkLookupScope(cmGeneratorTarget *this,string *n,cmLocalGenerator **lg)

{
  bool bVar1;
  cmLocalGenerator *pcVar2;
  string_view str;
  cmDirectoryId dirId;
  string local_40;
  
  str._M_str = (n->_M_dataplus)._M_p;
  str._M_len = n->_M_string_length;
  bVar1 = cmHasLiteralPrefix<4ul>(str,(char (*) [4])"::@");
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)n);
    cmDirectoryId::cmDirectoryId(&dirId,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (dirId.String._M_string_length == 0) {
      pcVar2 = this->LocalGenerator;
    }
    else {
      pcVar2 = cmGlobalGenerator::FindLocalGenerator(this->GlobalGenerator,&dirId);
      if (pcVar2 == (cmLocalGenerator *)0x0) {
        std::__cxx11::string::~string((string *)&dirId);
        goto LAB_0034e46f;
      }
    }
    *lg = pcVar2;
    std::__cxx11::string::~string((string *)&dirId);
    bVar1 = true;
  }
  else {
LAB_0034e46f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::IsLinkLookupScope(std::string const& n,
                                          cmLocalGenerator const*& lg) const
{
  if (cmHasLiteralPrefix(n, CMAKE_DIRECTORY_ID_SEP)) {
    cmDirectoryId const dirId = n.substr(sizeof(CMAKE_DIRECTORY_ID_SEP) - 1);
    if (dirId.String.empty()) {
      lg = this->LocalGenerator;
      return true;
    }
    if (cmLocalGenerator const* otherLG =
          this->GlobalGenerator->FindLocalGenerator(dirId)) {
      lg = otherLG;
      return true;
    }
  }
  return false;
}